

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O3

bool fast_float::long_mul<(unsigned_short)62>(stackvec<(unsigned_short)62> *x,limb_span y)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  unsigned_long __n2;
  ulong uVar13;
  ulong uVar14;
  size_t in_R8;
  ulong uVar15;
  int iVar16;
  limb_span y_00;
  stackvec<(unsigned_short)62> z;
  stackvec<(unsigned_short)62> local_420;
  undefined1 local_228 [496];
  ushort local_38;
  ulong uVar12;
  
  uVar15 = y.length;
  uVar10 = x->length;
  uVar12 = (ulong)uVar10;
  local_38 = 0;
  if (uVar12 < 0x3f) {
    if (uVar10 == 0) {
      uVar11 = 0;
    }
    else {
      memcpy(local_228,x,(ulong)((uint)uVar10 * 8));
      uVar11 = (uint)local_38;
    }
    iVar16 = uVar11 + uVar10;
    local_38 = (ushort)iVar16;
  }
  else {
    iVar16 = 0;
  }
  if (uVar15 != 0) {
    if (uVar10 == 0) {
      uVar12 = 0;
    }
    else {
      uVar1 = *y.ptr;
      uVar14 = 0;
      uVar13 = 0;
      do {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar13;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar1;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = x->data[uVar14];
        auVar6 = auVar2 * auVar4 + auVar6;
        uVar13 = auVar6._8_8_;
        x->data[uVar14] = auVar6._0_8_;
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
      if (uVar13 != 0) {
        if (0x3d < uVar10) {
          return false;
        }
        x->data[uVar12] = uVar13;
        uVar11 = uVar10 + 1;
        uVar12 = (ulong)uVar11;
        x->length = (uint16_t)uVar11;
      }
    }
    if (uVar15 != 1) {
      uVar10 = (ushort)iVar16;
      uVar12 = 2;
      if (2 < uVar15) {
        uVar12 = uVar15;
      }
      uVar15 = 1;
      do {
        uVar1 = y.ptr[uVar15];
        if (uVar1 != 0) {
          local_420.length = 0;
          if (0x3e < uVar10) {
            return false;
          }
          if (uVar10 == 0) {
            uVar11 = 0;
          }
          else {
            memcpy(&local_420,local_228,(ulong)(ushort)(uVar10 * 8));
            uVar11 = (uint)local_420.length;
          }
          uVar11 = uVar11 + iVar16;
          uVar9 = (ushort)uVar11;
          local_420.length = uVar9;
          if (uVar9 == 0) {
            uVar11 = 0;
          }
          else {
            in_R8 = 0;
            uVar13 = 0;
            do {
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar13;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = uVar1;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = local_420.data[in_R8];
              auVar7 = auVar3 * auVar5 + auVar7;
              uVar13 = auVar7._8_8_;
              local_420.data[in_R8] = auVar7._0_8_;
              in_R8 = in_R8 + 1;
            } while ((uVar11 & 0xffff) != in_R8);
            if (uVar13 != 0) {
              if (0x3d < uVar9) {
                return false;
              }
              local_420.data[uVar11 & 0xffff] = uVar13;
              uVar11 = uVar11 + 1;
              local_420.length = (uint16_t)uVar11;
            }
          }
          y_00.ptr = (unsigned_long *)(ulong)(uVar11 & 0xffff);
          y_00.length = uVar15;
          bVar8 = large_add_from<(unsigned_short)62>((fast_float *)x,&local_420,y_00,in_R8);
          if (!bVar8) {
            return false;
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar12);
      uVar12 = (ulong)x->length;
    }
  }
  uVar10 = (ushort)uVar12;
  while ((uVar10 != 0 && (x->data[(uVar12 & 0xffff) - 1] == 0))) {
    uVar10 = (short)uVar12 - 1;
    uVar12 = (ulong)uVar10;
    x->length = uVar10;
  }
  return true;
}

Assistant:

FASTFLOAT_CONSTEXPR20
bool long_mul(stackvec<size>& x, limb_span y) noexcept {
  limb_span xs = limb_span(x.data, x.len());
  stackvec<size> z(xs);
  limb_span zs = limb_span(z.data, z.len());

  if (y.len() != 0) {
    limb y0 = y[0];
    FASTFLOAT_TRY(small_mul(x, y0));
    for (size_t index = 1; index < y.len(); index++) {
      limb yi = y[index];
      stackvec<size> zi;
      if (yi != 0) {
        // re-use the same buffer throughout
        zi.set_len(0);
        FASTFLOAT_TRY(zi.try_extend(zs));
        FASTFLOAT_TRY(small_mul(zi, yi));
        limb_span zis = limb_span(zi.data, zi.len());
        FASTFLOAT_TRY(large_add_from(x, zis, index));
      }
    }
  }

  x.normalize();
  return true;
}